

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

bool __thiscall Js::ScriptContext::Close(ScriptContext *this,bool inDestructor)

{
  bool bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar1 = this->isScriptContextActuallyClosed;
  if (bVar1 == false) {
    InternalClose(this);
    if ((!inDestructor) && ((this->super_ScriptContextBase).globalObject != (GlobalObject *)0x0)) {
      bVar3 = IsClosedNativeCodeGenerator(this);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x344,"(this->IsClosedNativeCodeGenerator())",
                                    "this->IsClosedNativeCodeGenerator()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if ((this->threadContext->isThreadBound == true) &&
         ((((this->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
          chakraEngine.ptr == (ChakraEngine *)0x0)) {
        Memory::Recycler::RootRelease
                  (this->recycler,(this->super_ScriptContextBase).globalObject,(uint *)0x0);
      }
      (this->super_ScriptContextBase).globalObject = (GlobalObject *)0x0;
    }
    ThreadContext::SetForceOneIdleCollection(this->threadContext);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool ScriptContext::Close(bool inDestructor)
    {
        if (isScriptContextActuallyClosed)
        {
            return false;
        }

        InternalClose();

        if (!inDestructor && globalObject != nullptr)
        {
            //A side effect of releasing globalObject that this script context could be deleted, so the release call here
            //must be the last thing in close.
#if ENABLE_NATIVE_CODEGEN
            Assert(this->IsClosedNativeCodeGenerator());
#endif
            if (!GetThreadContext()->IsJSRT() && !GetLibrary()->IsChakraEngine())
            {
                GetRecycler()->RootRelease(globalObject);
            }
            globalObject = nullptr;
        }

        // A script context closing is a signal to the thread context that it
        // needs to do an idle GC independent of what the heuristics are
        this->threadContext->SetForceOneIdleCollection();

        return true;
    }